

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O3

int __thiscall
bssl::dtls1_write_record(bssl *this,SSL *ssl,int type,Span<const_unsigned_char> in,uint16_t epoch)

{
  SSLBuffer *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  size_t header_len;
  size_t sVar4;
  uchar *in_len;
  undefined4 in_register_00000014;
  uint8_t local_4c;
  size_t ciphertext_len;
  DTLSRecordNumber record_number;
  
  in_len = in.data_;
  if ((uchar *)0x4000 < in_len) {
    __assert_fail("in.size() <= SSL3_RT_MAX_PLAIN_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0x10f,"int bssl::dtls1_write_record(SSL *, int, Span<const uint8_t>, uint16_t)");
  }
  lVar1 = *(long *)(this + 0x30);
  if (*(short *)(lVar1 + 0x72) == 0) {
    this_00 = (SSLBuffer *)(lVar1 + 0x68);
    record_number.combined_ = 0;
    header_len = dtls_seal_prefix_len((SSL *)this,(uint16_t)in.size_);
    sVar4 = SSL_max_seal_overhead((SSL *)this);
    bVar2 = SSLBuffer::EnsureCap(this_00,header_len,(size_t)(in_len + sVar4));
    if (bVar2) {
      local_4c = (uint8_t)ssl;
      bVar2 = dtls_seal_record((SSL *)this,&record_number,
                               (uint8_t *)
                               ((ulong)*(ushort *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68) +
                               (ulong)*(ushort *)(lVar1 + 0x72)),&ciphertext_len,
                               (ulong)*(ushort *)(lVar1 + 0x74) - (ulong)*(ushort *)(lVar1 + 0x72),
                               local_4c,(uint8_t *)CONCAT44(in_register_00000014,type),
                               (size_t)in_len,(uint16_t)in.size_);
      if (bVar2) {
        SSLBuffer::DidWrite(this_00,ciphertext_len);
        iVar3 = ssl_write_buffer_flush((SSL *)this);
        if (0 < iVar3) {
          return 1;
        }
        return iVar3;
      }
    }
    SSLBuffer::Clear(this_00);
    return -1;
  }
  __assert_fail("buf->empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                ,0x113,"int bssl::dtls1_write_record(SSL *, int, Span<const uint8_t>, uint16_t)");
}

Assistant:

int dtls1_write_record(SSL *ssl, int type, Span<const uint8_t> in,
                       uint16_t epoch) {
  SSLBuffer *buf = &ssl->s3->write_buffer;
  assert(in.size() <= SSL3_RT_MAX_PLAIN_LENGTH);
  // There should never be a pending write buffer in DTLS. One can't write half
  // a datagram, so the write buffer is always dropped in
  // |ssl_write_buffer_flush|.
  assert(buf->empty());

  if (in.size() > SSL3_RT_MAX_PLAIN_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return -1;
  }

  DTLSRecordNumber record_number;
  size_t ciphertext_len;
  if (!buf->EnsureCap(dtls_seal_prefix_len(ssl, epoch),
                      in.size() + SSL_max_seal_overhead(ssl)) ||
      !dtls_seal_record(ssl, &record_number, buf->remaining().data(),
                        &ciphertext_len, buf->remaining().size(), type,
                        in.data(), in.size(), epoch)) {
    buf->Clear();
    return -1;
  }
  buf->DidWrite(ciphertext_len);

  int ret = ssl_write_buffer_flush(ssl);
  if (ret <= 0) {
    return ret;
  }
  return 1;
}